

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

string * __thiscall
pbrt::SpectrumCheckerboardTexture::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SpectrumCheckerboardTexture *this)

{
  AAMethod AVar1;
  ulong uVar2;
  ulong uVar3;
  char *local_88;
  string local_80;
  char *local_60;
  char *local_58;
  string local_50;
  
  uVar2 = (this->map2D).
          super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
          .bits;
  local_88 = "(nullptr)";
  if ((uVar2 & 0xffffffffffff) != 0) {
    TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
    ::ToString_abi_cxx11_
              (&local_50,
               (TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                *)this);
    local_88 = local_50._M_dataplus._M_p;
  }
  uVar3 = (this->map3D).super_TaggedPointer<pbrt::TransformMapping3D>.bits;
  local_58 = "(nullptr)";
  if ((uVar3 & 0xffffffffffff) != 0) {
    TaggedPointer<pbrt::TransformMapping3D>::ToString_abi_cxx11_
              (&local_80,&(this->map3D).super_TaggedPointer<pbrt::TransformMapping3D>);
    local_58 = local_80._M_dataplus._M_p;
  }
  local_60 = "closed-form";
  AVar1 = this->aaMethod;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (AVar1 == None) {
    local_60 = "none";
  }
  detail::
  stringPrintfRecursive<char_const*,char_const*,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,char_const*>
            (__return_storage_ptr__,
             "[ SpectrumCheckerboardTexture map2D: %s map3D: %s tex[0]: %s tex[1]: %s aaMethod: %s]"
             ,&local_88,&local_58,this->tex,this->tex + 1,&local_60);
  if (((uVar3 & 0xffffffffffff) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2)) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (((uVar2 & 0xffffffffffff) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SpectrumCheckerboardTexture::ToString() const {
    return StringPrintf("[ SpectrumCheckerboardTexture map2D: %s map3D: %s "
                        "tex[0]: %s tex[1]: %s aaMethod: %s]",
                        map2D ? map2D.ToString().c_str() : "(nullptr)",
                        map3D ? map3D.ToString().c_str() : "(nullptr)", tex[0], tex[1],
                        aaMethod == AAMethod::None ? "none" : "closed-form");
}